

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageLoader::create_macro_symtab_lookup_table(CVmImageLoader *this)

{
  CVmObjPageEntry *this_00;
  CVmObjPageEntry *this_01;
  vm_runtime_sym *pvVar1;
  char *__s;
  anon_union_8_8_cb74652f_for_val aVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  vm_val_t *pvVar6;
  vm_obj_id_t vVar7;
  size_t bytelen;
  ulong uVar8;
  size_t idx;
  vm_val_t v;
  vm_val_t lst;
  vm_val_t str;
  vm_val_t args;
  vm_val_t local_78;
  vm_val_t local_68;
  CVmObjLookupTable *local_58;
  vm_val_t local_50;
  vm_val_t local_40;
  
  if (this->runtime_macros_ != (CVmRuntimeSymbols *)0x0) {
    if (this->reflection_macros_ == 0) {
      vVar7 = CVmObjLookupTable::create(0,0x100,(uint)this->runtime_macros_->cnt_);
      this->reflection_macros_ = vVar7;
      pvVar5 = sp_;
      local_58 = (CVmObjLookupTable *)
                 ((long)&G_obj_table_X.pages_[vVar7 >> 0xc]->ptr_ + (ulong)((vVar7 & 0xfff) * 0x18))
      ;
      pvVar4 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar4 = VM_OBJ;
      (pvVar5->val).obj = vVar7;
      for (pvVar1 = this->runtime_macros_->head_; pvVar1 != (vm_runtime_sym *)0x0;
          pvVar1 = pvVar1->nxt) {
        local_50.val.obj = CVmObjString::create(0,pvVar1->sym,pvVar1->len);
        pvVar5 = sp_;
        local_50.typ = VM_OBJ;
        aVar3._4_4_ = local_50.val._4_4_;
        aVar3.obj = local_50.val.obj;
        pvVar6 = sp_ + 1;
        *(ulong *)sp_ = CONCAT44(local_50._4_4_,5);
        sp_ = pvVar6;
        pvVar5->val = aVar3;
        local_68.val.obj = CVmObjList::create(0,3);
        pvVar5 = sp_;
        local_68.typ = VM_OBJ;
        aVar2._4_4_ = local_68.val._4_4_;
        aVar2.obj = local_68.val.obj;
        pvVar6 = sp_ + 1;
        *(ulong *)sp_ = CONCAT44(local_68._4_4_,5);
        sp_ = pvVar6;
        pvVar5->val = aVar2;
        this_00 = G_obj_table_X.pages_[local_68.val.obj >> 0xc] + (local_68.val.obj & 0xfff);
        uVar8 = (ulong)**(ushort **)((long)&this_00->ptr_ + 8);
        if (uVar8 != 0) {
          CVmObjList::cons_clear((CVmObjList *)this_00,0,uVar8 - 1);
        }
        local_78.val.obj = CVmObjString::create(0,pvVar1->macro_expansion,pvVar1->macro_exp_len);
        local_78.typ = VM_OBJ;
        CVmObjList::cons_set_element((CVmObjList *)this_00,0,&local_78);
        local_40.val.obj = CVmObjList::create(0,(long)pvVar1->macro_argc);
        local_40.typ = VM_OBJ;
        this_01 = G_obj_table_X.pages_[local_40.val.obj >> 0xc] + (local_40.val.obj & 0xfff);
        uVar8 = (ulong)**(ushort **)((long)&this_01->ptr_ + 8);
        if (uVar8 != 0) {
          CVmObjList::cons_clear((CVmObjList *)this_01,0,uVar8 - 1);
        }
        CVmObjList::cons_set_element((CVmObjList *)this_00,1,&local_40);
        if (0 < pvVar1->macro_argc) {
          idx = 0;
          do {
            __s = pvVar1->macro_args[idx];
            bytelen = strlen(__s);
            local_78.val.obj = CVmObjString::create(0,__s,bytelen);
            local_78.typ = VM_OBJ;
            CVmObjList::cons_set_element((CVmObjList *)this_01,idx,&local_78);
            idx = idx + 1;
          } while ((long)idx < (long)pvVar1->macro_argc);
        }
        local_78.val.obj = pvVar1->macro_flags;
        local_78.typ = VM_INT;
        CVmObjList::cons_set_element((CVmObjList *)this_00,2,&local_78);
        CVmObjLookupTable::add_entry(local_58,&local_50,&local_68);
        sp_ = sp_ + -2;
      }
      sp_ = sp_ + -1;
    }
  }
  return;
}

Assistant:

void CVmImageLoader::create_macro_symtab_lookup_table(VMG0_)
{
    CVmObjLookupTable *lookup;
    vm_runtime_sym *sym;

    /* 
     *   if we don't have a runtime macro table, we can't create the
     *   reflection LookupTable 
     */
    if (runtime_macros_ == 0)
        return;

    /* if we already created the table, there's no need to create another */
    if (reflection_macros_ != VM_INVALID_OBJ)
        return;

    /* create a LookupTable to hold the symbols */
    reflection_macros_ = CVmObjLookupTable::
        create(vmg_ FALSE, 256, runtime_macros_->get_sym_count());

    /* get the object, properly cast */
    lookup = (CVmObjLookupTable *)vm_objp(vmg_ reflection_macros_);

    /* push the lookup table onto the stack for gc protection */
    G_stk->push()->set_obj(reflection_macros_);

    /* run through the symbols and populate the LookupTable */
    for (sym = runtime_macros_->get_head() ; sym != 0 ; sym = sym->nxt)
    {
        vm_val_t str;
        vm_val_t lst;
        vm_val_t args;
        vm_val_t v;
        int i;

        /* create a string object to hold this symbol */
        str.set_obj(CVmObjString::create(vmg_ FALSE, sym->sym, sym->len));

        /* stack it for gc protection */
        G_stk->push(&str);

        /* 
         *   Create a list to hold the definition.  We represent this as
         *   [expansion_string, [argument_list], flags]. 
         */
        lst.set_obj(CVmObjList::create(vmg_ FALSE, 3));
        G_stk->push(&lst);
        CVmObjList *lstp = (CVmObjList *)vm_objp(vmg_ lst.val.obj);
        lstp->cons_clear();

        /* create and store the expansion string */
        v.set_obj(CVmObjString::create(
            vmg_ FALSE, sym->macro_expansion, sym->macro_exp_len));
        lstp->cons_set_element(0, &v);

        /* create the argument list */
        args.set_obj(CVmObjList::create(vmg_ FALSE, sym->macro_argc));
        CVmObjList *argp = (CVmObjList *)vm_objp(vmg_ args.val.obj);
        argp->cons_clear();

        /* store the argument list in the definition list */
        lstp->cons_set_element(1, &args);

        /* store the arguments */
        for (i = 0 ; i < sym->macro_argc ; ++i)
        {
            /* create the string */
            char *p = sym->macro_args[i];
            size_t len = strlen(p);
            v.set_obj(CVmObjString::create(vmg_ FALSE, p, len));

            /* store it in the argument list */
            argp->cons_set_element(i, &v);
        }

        /* store the flags */
        v.set_int(sym->macro_flags);
        lstp->cons_set_element(2, &v);

        /* 
         *   add the macro to the lookup table - the symbol string is the
         *   key, and the symbol's value is the definition list
         */
        lookup->add_entry(vmg_ &str, &lst);

        /* done with the symbol and list gc protection */
        G_stk->discard(2);
    }

    /* done working - discard our gc protection */
    G_stk->discard();
}